

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

cf_bool_t cf_str_switch_case(cf_char_t *s)

{
  char cVar1;
  cf_bool_t cVar2;
  char cVar3;
  
  if (s == (cf_char_t *)0x0) {
    cVar2 = 0;
  }
  else {
    cVar2 = 1;
    for (; cVar1 = *s, cVar1 != '\0'; s = s + 1) {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        cVar3 = cVar1 + -0x20;
      }
      else {
        cVar3 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar3 = cVar1;
        }
      }
      *s = cVar3;
    }
  }
  return cVar2;
}

Assistant:

cf_bool_t cf_str_switch_case(cf_char_t* s) {
    cf_char_t* p = CF_NULL_PTR;
    if (!s) return CF_FALSE;

    for (p = s; *p != '\0'; p++) {
        if (CF_IS_LOWER_ALPHA(*p)) {
            *p = CF_TO_UPPER_ALPHA(*p);
        } else {
            *p = CF_TO_LOWER_ALPHA(*p);
        }
    }
    return CF_TRUE;
}